

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-fuzz-types.cpp
# Opt level: O0

void __thiscall wasm::Fuzzer::checkInhabitable(Fuzzer *this)

{
  __node_base_ptr p_Var1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  int iVar5;
  size_type sVar6;
  size_type sVar7;
  reference pvVar8;
  reference pvVar9;
  Fatal *pFVar10;
  __node_base_ptr p_Var11;
  Printed local_6d8;
  Fatal local_6b0;
  allocator<char> local_521;
  string local_520;
  undefined1 local_500 [8];
  IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator> print_1;
  size_t i_1;
  uintptr_t local_2e0;
  Printed local_2d8;
  Fatal local_2b0;
  ulong local_128;
  size_t i;
  string local_118;
  undefined1 local_f8 [8];
  IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator> print;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> verifiedInhabitable;
  bool haveUninhabitable;
  undefined1 local_28 [8];
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> inhabitable;
  Fuzzer *this_local;
  
  inhabitable.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  HeapTypeGenerator::makeInhabitable
            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_28,&this->types);
  if ((this->verbose & 1U) != 0) {
    std::operator<<((ostream *)&std::cout,"\nInhabitable types:\n\n");
    printTypes((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_28);
  }
  HeapTypeGenerator::getInhabitable
            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
             &verifiedInhabitable.
              super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&this->types);
  sVar6 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::size
                    ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                     &verifiedInhabitable.
                      super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  sVar7 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::size(&this->types);
  std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector
            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
             &verifiedInhabitable.
              super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  if (sVar6 == sVar7) {
    iVar5 = wasm::getTypeSystem();
    if (iVar5 == 0) {
      sVar6 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::size(&this->types);
      sVar7 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::size
                        ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_28);
      if (sVar6 != sVar7) {
        Fatal::Fatal((Fatal *)&i_1);
        Fatal::operator<<((Fatal *)&i_1,
                          (char (*) [68])
                          "Number of inhabitable types does not match number of original types");
        Fatal::~Fatal((Fatal *)&i_1);
      }
      for (print_1.names._M_h._M_single_bucket = (__node_base_ptr)0x0;
          p_Var1 = print_1.names._M_h._M_single_bucket,
          p_Var11 = (__node_base_ptr)
                    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::size(&this->types)
          , p_Var1 < p_Var11;
          print_1.names._M_h._M_single_bucket =
               (__node_base_ptr)((long)&(print_1.names._M_h._M_single_bucket)->_M_nxt + 1)) {
        pvVar8 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                           (&this->types,(size_type)print_1.names._M_h._M_single_bucket);
        pvVar9 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                           ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_28,
                            (size_type)print_1.names._M_h._M_single_bucket);
        bVar4 = HeapType::operator!=(pvVar8,pvVar9);
        if (bVar4) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_520,"",&local_521);
          IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>::
          IndexedTypeNameGenerator<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
                    ((IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator> *)local_500,
                     &this->types,&local_520);
          std::__cxx11::string::~string((string *)&local_520);
          std::allocator<char>::~allocator(&local_521);
          Fatal::Fatal(&local_6b0);
          pFVar10 = Fatal::operator<<(&local_6b0,
                                      (char (*) [42])"makeInhabitable incorrectly changed type ");
          pvVar8 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                             (&this->types,(size_type)print_1.names._M_h._M_single_bucket);
          TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>::
          operator()(&local_6d8,
                     (TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>
                      *)local_500,(HeapType)pvVar8->id);
          Fatal::operator<<(pFVar10,&local_6d8);
          HeapType::Printed::~Printed(&local_6d8);
          Fatal::~Fatal(&local_6b0);
        }
      }
    }
  }
  else {
    HeapTypeGenerator::getInhabitable
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
               &print.names._M_h._M_single_bucket,
               (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_28);
    sVar6 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::size
                      ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                       &print.names._M_h._M_single_bucket);
    sVar7 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::size
                      ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_28);
    if (sVar6 != sVar7) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_118,"",(allocator<char> *)((long)&i + 7));
      IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>::
      IndexedTypeNameGenerator<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
                ((IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator> *)local_f8,
                 (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_28,&local_118);
      std::__cxx11::string::~string((string *)&local_118);
      std::allocator<char>::~allocator((allocator<char> *)((long)&i + 7));
      for (local_128 = 0; uVar2 = local_128,
          sVar6 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::size
                            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_28),
          uVar3 = local_128, uVar2 < sVar6; local_128 = local_128 + 1) {
        sVar6 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::size
                          ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                           &print.names._M_h._M_single_bucket);
        if (sVar6 < uVar3) {
LAB_00253b83:
          Fatal::Fatal(&local_2b0);
          pFVar10 = Fatal::operator<<(&local_2b0,(char (*) [27])"Found uninhabitable type: ");
          pvVar8 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                             ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_28,
                              local_128);
          local_2e0 = pvVar8->id;
          TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>::
          operator()(&local_2d8,
                     (TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>
                      *)local_f8,(HeapType)local_2e0);
          Fatal::operator<<(pFVar10,&local_2d8);
          HeapType::Printed::~Printed(&local_2d8);
          Fatal::~Fatal(&local_2b0);
        }
        pvVar8 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                           ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_28,
                            local_128);
        pvVar9 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                           ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                            &print.names._M_h._M_single_bucket,local_128);
        bVar4 = HeapType::operator!=(pvVar8,pvVar9);
        if (bVar4) goto LAB_00253b83;
      }
      IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>::~IndexedTypeNameGenerator
                ((IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator> *)local_f8);
    }
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
               &print.names._M_h._M_single_bucket);
  }
  std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector
            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_28);
  return;
}

Assistant:

void Fuzzer::checkInhabitable() {
  std::vector<HeapType> inhabitable = HeapTypeGenerator::makeInhabitable(types);
  if (verbose) {
    std::cout << "\nInhabitable types:\n\n";
    printTypes(inhabitable);
  }

  // Check whether any of the original types are uninhabitable.
  bool haveUninhabitable =
    HeapTypeGenerator::getInhabitable(types).size() != types.size();
  if (haveUninhabitable) {
    // Verify that the transformed types are inhabitable.
    auto verifiedInhabitable = HeapTypeGenerator::getInhabitable(inhabitable);
    if (verifiedInhabitable.size() != inhabitable.size()) {
      IndexedTypeNameGenerator print(inhabitable);
      for (size_t i = 0; i < inhabitable.size(); ++i) {
        if (i > verifiedInhabitable.size() ||
            inhabitable[i] != verifiedInhabitable[i]) {
          Fatal() << "Found uninhabitable type: " << print(inhabitable[i]);
        }
      }
    }
    // TODO: We could also check that the transformed types are the same as the
    // original types up to nullability.
  } else if (getTypeSystem() == TypeSystem::Isorecursive) {
    // Verify the produced inhabitable types are the same as the original types
    // (which also implies that they are indeed inhabitable).
    if (types.size() != inhabitable.size()) {
      Fatal() << "Number of inhabitable types does not match number of "
                 "original types";
    }
    for (size_t i = 0; i < types.size(); ++i) {
      if (types[i] != inhabitable[i]) {
        IndexedTypeNameGenerator print(types);
        Fatal() << "makeInhabitable incorrectly changed type "
                << print(types[i]);
      }
    }
  }
}